

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O1

bool __thiscall
CppJieba::MixSegment::cut_type
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  unsigned_short *__args;
  pointer puVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pvVar9;
  ulong uVar10;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  hmmRes;
  Unicode unico;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> infos;
  string tmp;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_e8;
  const_iterator local_c8;
  iterator iStack_c0;
  unsigned_short *local_b8;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> local_a8;
  MixSegment *local_88;
  string local_80;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  HMMSegment *local_38;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0xad,
                  "virtual bool CppJieba::MixSegment::cut_type(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  if (begin._M_current == end._M_current) {
    bVar4 = false;
  }
  else {
    local_a8.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = MPSegment::cut(&this->_mpSeg,begin,end,&local_a8);
    if (bVar4) {
      local_c8._M_current = (unsigned_short *)0x0;
      iStack_c0._M_current = (unsigned_short *)0x0;
      uVar8 = 0;
      local_b8 = (unsigned_short *)0x0;
      local_e8.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_88 = this;
      if (local_a8.
          super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_a8.
          super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_38 = &this->_hmmSeg;
        local_40 = res;
        do {
          TransCode::encode(&local_a8.
                             super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar8].word,&local_80);
          pvVar3 = local_e8.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar2 = local_e8.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __args = local_a8.
                   super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8].word.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)local_a8.
                    super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].word.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__args == 2) {
            if (iStack_c0._M_current == local_b8) {
              std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_c8,
                         iStack_c0,__args);
            }
            else {
              *iStack_c0._M_current = *__args;
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
          }
          else {
            if (local_c8._M_current != iStack_c0._M_current) {
              pvVar9 = local_e8.
                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (local_e8.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_e8.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                do {
                  puVar1 = (pvVar9->
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  if (puVar1 != (pointer)0x0) {
                    operator_delete(puVar1);
                  }
                  pvVar9 = pvVar9 + 1;
                } while (pvVar9 != pvVar3);
                local_e8.
                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
              }
              bVar4 = HMMSegment::cut(local_38,local_c8,(const_iterator)iStack_c0._M_current,
                                      &local_e8);
              res = local_40;
              if (!bVar4) {
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,"_hmmSeg cut failed.","");
                Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xc9,&local_60);
                goto LAB_0010eb58;
              }
              if (local_e8.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_e8.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar7 = 0;
                uVar10 = 1;
                do {
                  TransCode::encode(local_e8.
                                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar7,&local_80);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(res,&local_80);
                  uVar7 = ((long)local_e8.
                                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_e8.
                                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555;
                  bVar4 = uVar10 <= uVar7;
                  lVar6 = uVar7 - uVar10;
                  uVar7 = uVar10;
                  uVar10 = (ulong)((int)uVar10 + 1);
                } while (bVar4 && lVar6 != 0);
              }
            }
            if (iStack_c0._M_current != local_c8._M_current) {
              iStack_c0._M_current = local_c8._M_current;
            }
            if (((local_a8.
                  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].tag._M_string_length == 0) ||
                (lVar6 = std::__cxx11::string::find
                                   ((char *)&local_a8.
                                             super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar8].tag,
                                    0x116b8b,0), lVar6 != -1)) ||
               (lVar6 = std::__cxx11::string::find
                                  ((char *)&local_a8.
                                            super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar8].tag,
                                   0x116b8d,0), lVar6 != -1)) {
              TransCode::encode(&local_a8.
                                 super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].word,&local_80);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,&local_80);
            }
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar7 = ((long)local_a8.
                         super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.
                         super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
      }
      pvVar3 = local_e8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar2 = local_e8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = true;
      if (local_c8._M_current != iStack_c0._M_current) {
        pvVar9 = local_e8.
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_e8.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_e8.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            puVar1 = (pvVar9->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if (puVar1 != (pointer)0x0) {
              operator_delete(puVar1);
            }
            pvVar9 = pvVar9 + 1;
          } while (pvVar9 != pvVar3);
          local_e8.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
        }
        bVar5 = HMMSegment::cut(&local_88->_hmmSeg,local_c8,(const_iterator)iStack_c0._M_current,
                                &local_e8);
        if (bVar5) {
          if (local_e8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_e8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar8 = 0;
            uVar7 = 1;
            do {
              TransCode::encode(local_e8.
                                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar8,&local_80);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,&local_80);
              uVar8 = ((long)local_e8.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e8.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              bVar5 = uVar7 <= uVar8;
              lVar6 = uVar8 - uVar7;
              uVar8 = uVar7;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (bVar5 && lVar6 != 0);
          }
        }
        else {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"_hmmSeg cut failed.","");
          Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xe6,&local_60);
LAB_0010eb58:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          bVar4 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector(&local_e8);
      if (local_c8._M_current != (unsigned_short *)0x0) {
        operator_delete(local_c8._M_current);
      }
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"mpSeg cutDAG failed.","")
      ;
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0xb5,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      bVar4 = false;
    }
    std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::~vector(&local_a8)
    ;
  }
  return bVar4;
}

Assistant:

virtual bool cut_type(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<TrieNodeInfo> infos;
                if(!_mpSeg.cut(begin, end, infos))
                {
                    LogError("mpSeg cutDAG failed.");
                    return false;
                }
                Unicode unico;
                vector<Unicode> hmmRes;
                string tmp;
                for(uint i= 0; i < infos.size(); i++)
                {
                    TransCode::encode(infos[i].word,tmp);
                    if(1 == infos[i].word.size())
                    {
                        unico.push_back(infos[i].word[0]);
                    }
                    else
                    {
                        if(!unico.empty())
                        {
                            hmmRes.clear();
                            if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                            {
                                LogError("_hmmSeg cut failed.");
                                return false;
                            }
                            for(uint j = 0; j < hmmRes.size(); j++)
                            {
                                TransCode::encode(hmmRes[j], tmp);
                                res.push_back(tmp);
                            }
                        }
                        unico.clear();

						/* Ignore "Not n,v words" */
						//TransCode::encode(infos[i].word, tmp); //Just test
						//cout<<tmp<<infos[i].tag<<" / ";
						if( (infos[i].tag.empty())
								|| (string::npos != infos[i].tag.find("n"))
								|| (string::npos != infos[i].tag.find("v"))
							)
						{
							TransCode::encode(infos[i].word, tmp);
							res.push_back(tmp);
						}
                    }
                }
                if(!unico.empty())
                {
                    hmmRes.clear();
                    if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                    {
                        LogError("_hmmSeg cut failed.");
                        return false;
                    }
                    for(uint j = 0; j < hmmRes.size(); j++)
                    {
                        TransCode::encode(hmmRes[j], tmp);
                        res.push_back(tmp);
                    }
                }

                return true;
            }